

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall
FIX::Session::generateResendRequest(Session *this,BeginString *beginString,MsgSeqNum *msgSeqNum)

{
  bool bVar1;
  SEQNUM SVar2;
  uint64_t uVar3;
  IntTConvertor<unsigned_long> *pIVar4;
  uint64_t uVar5;
  unsigned_long value;
  unsigned_long value_00;
  string *__lhs;
  FieldBase local_300;
  string local_2a8;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  EndSeqNo endSeqNo;
  BeginSeqNo beginSeqNo;
  Message resendRequest;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&endSeqNo,"2",(allocator<char> *)&local_300);
  MsgType::MsgType((MsgType *)&beginSeqNo,(STRING *)&endSeqNo);
  newMessage(&resendRequest,this,(MsgType *)&beginSeqNo);
  FieldBase::~FieldBase((FieldBase *)&beginSeqNo);
  std::__cxx11::string::~string((string *)&endSeqNo);
  SVar2 = SessionState::getNextTargetMsgSeqNum(&this->m_state);
  BeginSeqNo::BeginSeqNo(&beginSeqNo,(long)(int)SVar2);
  uVar3 = UInt64Field::getValue(&msgSeqNum->super_SeqNumField);
  EndSeqNo::EndSeqNo(&endSeqNo,uVar3 - 1);
  __lhs = &(beginString->super_StringField).super_FieldBase.m_string;
  bVar1 = std::operator>=(__lhs,"FIX.4.2");
  if (bVar1) {
    EndSeqNo::EndSeqNo((EndSeqNo *)&local_300,0);
    FieldBase::operator=((FieldBase *)&endSeqNo,&local_300);
  }
  else {
    bVar1 = std::operator<=(__lhs,"FIX.4.1");
    if (!bVar1) goto LAB_001b0f9a;
    EndSeqNo::EndSeqNo((EndSeqNo *)&local_300,999999);
    FieldBase::operator=((FieldBase *)&endSeqNo,&local_300);
  }
  FieldBase::~FieldBase(&local_300);
LAB_001b0f9a:
  FieldMap::setField(&resendRequest.super_FieldMap,(FieldBase *)&beginSeqNo,true);
  FieldMap::setField(&resendRequest.super_FieldMap,(FieldBase *)&endSeqNo,true);
  fill(this,&resendRequest.m_header);
  sendRaw(this,&resendRequest,0);
  pIVar4 = (IntTConvertor<unsigned_long> *)UInt64Field::getValue(&beginSeqNo.super_SeqNumField);
  IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_288,pIVar4,value);
  std::operator+(&local_268,"Sent ResendRequest FROM: ",&local_288);
  std::operator+(&local_248,&local_268," TO: ");
  pIVar4 = (IntTConvertor<unsigned_long> *)UInt64Field::getValue(&endSeqNo.super_SeqNumField);
  IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_2a8,pIVar4,value_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_300,
                 &local_248,&local_2a8);
  SessionState::onEvent(&this->m_state,(string *)&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  uVar3 = UInt64Field::getValue(&beginSeqNo.super_SeqNumField);
  uVar5 = UInt64Field::getValue(&msgSeqNum->super_SeqNumField);
  (this->m_state).m_resendRange.first = uVar3;
  (this->m_state).m_resendRange.second = uVar5 - 1;
  FieldBase::~FieldBase((FieldBase *)&endSeqNo);
  FieldBase::~FieldBase((FieldBase *)&beginSeqNo);
  Message::~Message(&resendRequest);
  return;
}

Assistant:

void Session::generateResendRequest(const BeginString &beginString, const MsgSeqNum &msgSeqNum) {
  Message resendRequest = newMessage(MsgType(MsgType_ResendRequest));

  BeginSeqNo beginSeqNo((int)getExpectedTargetNum());
  EndSeqNo endSeqNo(msgSeqNum - 1);
  if (beginString >= FIX::BeginString_FIX42) {
    endSeqNo = 0;
  } else if (beginString <= FIX::BeginString_FIX41) {
    endSeqNo = 999999;
  }
  resendRequest.setField(beginSeqNo);
  resendRequest.setField(endSeqNo);
  fill(resendRequest.getHeader());
  sendRaw(resendRequest);

  m_state.onEvent(
      "Sent ResendRequest FROM: " + SEQNUM_CONVERTOR::convert(beginSeqNo)
      + " TO: " + SEQNUM_CONVERTOR::convert(endSeqNo));

  m_state.resendRange(beginSeqNo, msgSeqNum - 1);
}